

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O1

void X86_ATT_printInst(MCInst *MI,SStream *OS,void *info)

{
  uint8_t *puVar1;
  char cVar2;
  byte bVar3;
  _Bool _Var4;
  uint uVar5;
  x86_reg xVar6;
  undefined8 in_RAX;
  MCOperand *pMVar7;
  int64_t iVar8;
  MCRegisterClass *c;
  cs_detail *pcVar9;
  long lVar10;
  ulong uVar11;
  SStream *O;
  MCRegisterInfo *extraout_RDX;
  MCRegisterInfo *extraout_RDX_00;
  MCRegisterInfo *extraout_RDX_01;
  MCRegisterInfo *extraout_RDX_02;
  MCRegisterInfo *extraout_RDX_03;
  MCRegisterInfo *extraout_RDX_04;
  MCRegisterInfo *extraout_RDX_05;
  MCRegisterInfo *extraout_RDX_06;
  MCRegisterInfo *extraout_RDX_07;
  MCRegisterInfo *extraout_RDX_08;
  MCRegisterInfo *extraout_RDX_09;
  ulong uVar12;
  MCRegisterInfo *extraout_RDX_10;
  MCRegisterInfo *extraout_RDX_11;
  MCRegisterInfo *extraout_RDX_12;
  MCRegisterInfo *extraout_RDX_13;
  MCRegisterInfo *pMVar13;
  MCRegisterInfo *extraout_RDX_14;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  x86_reg reg;
  x86_reg reg2;
  undefined8 local_38;
  
  local_38 = in_RAX;
  if ((MI->csh->mode == CS_MODE_64) && (uVar5 = MCInst_getOpcode(MI), uVar5 == 0x163)) {
    SStream_concat0(OS,"callq\t");
    MCInst_setOpcodePub(MI,0x38);
    printPCRelImm(MI,(uint)OS,O);
    return;
  }
  uVar5 = MCInst_getOpcode(MI);
  pcVar16 = (char *)0x0;
  pMVar13 = extraout_RDX;
  if ((int)uVar5 < 0x269) {
    if (uVar5 == 0x15) {
      uVar5 = MCInst_getNumOperands(MI);
      pMVar13 = extraout_RDX_04;
      if (uVar5 == 1) {
        pcVar16 = (char *)0x0;
        pMVar7 = MCInst_getOperand(MI,0);
        _Var4 = MCOperand_isImm(pMVar7);
        pMVar13 = extraout_RDX_05;
        if (_Var4) {
          pcVar16 = (char *)0x0;
          pMVar7 = MCInst_getOperand(MI,0);
          iVar8 = MCOperand_getImm(pMVar7);
          pMVar13 = extraout_RDX_06;
          if (iVar8 == 10) {
            pcVar16 = "aad";
            goto LAB_001452fe;
          }
        }
      }
      else {
LAB_0014532d:
        pcVar16 = (char *)0x0;
      }
    }
    else {
      pcVar16 = (char *)0x0;
      if (uVar5 == 0x16) {
        uVar5 = MCInst_getNumOperands(MI);
        pMVar13 = extraout_RDX_00;
        if (uVar5 != 1) goto LAB_0014532d;
        pcVar16 = (char *)0x0;
        pMVar7 = MCInst_getOperand(MI,0);
        _Var4 = MCOperand_isImm(pMVar7);
        pMVar13 = extraout_RDX_01;
        if (_Var4) {
          pcVar16 = (char *)0x0;
          pMVar7 = MCInst_getOperand(MI,0);
          iVar8 = MCOperand_getImm(pMVar7);
          pMVar13 = extraout_RDX_02;
          if (iVar8 == 10) {
            pcVar16 = "aam";
            goto LAB_001452fe;
          }
        }
      }
    }
  }
  else if (uVar5 == 0x269) {
    uVar5 = MCInst_getNumOperands(MI);
    pMVar13 = extraout_RDX_07;
    if (uVar5 != 6) goto LAB_0014532d;
    pcVar16 = (char *)0x0;
    pMVar7 = MCInst_getOperand(MI,0);
    _Var4 = MCOperand_isReg(pMVar7);
    pMVar13 = extraout_RDX_08;
    if (_Var4) {
      c = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,0x2a);
      pcVar16 = (char *)0x0;
      pMVar7 = MCInst_getOperand(MI,0);
      uVar5 = MCOperand_getReg(pMVar7);
      _Var4 = MCRegisterClass_contains(c,uVar5);
      pMVar13 = extraout_RDX_09;
      if (_Var4) {
        pcVar16 = anon_var_dwarf_11012;
        goto LAB_001452fe;
      }
    }
  }
  else if (uVar5 == 0x1879) {
    uVar5 = MCInst_getNumOperands(MI);
    pMVar13 = extraout_RDX_03;
    if (uVar5 != 0) goto LAB_0014532d;
    pcVar16 = "xstorerng";
LAB_001452fe:
    pcVar16 = cs_strdup(pcVar16);
    for (pcVar14 = pcVar16; cVar2 = *pcVar14, cVar2 != '\0'; pcVar14 = pcVar14 + 1) {
      if ((cVar2 == ' ') || (cVar2 == '\t')) {
        *pcVar14 = '\0';
        pcVar14 = pcVar14 + 1;
        break;
      }
    }
    SStream_concat0(OS,pcVar16);
    pMVar13 = extraout_RDX_10;
    if (*pcVar14 != '\0') {
      SStream_concat0(OS,anon_var_dwarf_794b2 + 0x11);
      pMVar13 = extraout_RDX_11;
      do {
        cVar2 = *pcVar14;
        if (cVar2 == '$') {
          if (pcVar14[1] == -1) {
            pcVar15 = pcVar14 + 3;
            if (pcVar14[3] == '\x01') {
              cVar2 = pcVar14[2];
              MI->x86opsize = '\b';
              printMemReference(MI,(int)cVar2 - 1,OS);
              pMVar13 = extraout_RDX_14;
            }
          }
          else {
            pcVar15 = pcVar14 + 1;
            printOperand(MI,(int)pcVar14[1] - 1,OS);
            pMVar13 = extraout_RDX_13;
          }
        }
        else {
          if (cVar2 == '\0') break;
          SStream_concat(OS,"%c",(ulong)(uint)(int)cVar2);
          pMVar13 = extraout_RDX_12;
          pcVar15 = pcVar14;
        }
        pcVar14 = pcVar15 + 1;
      } while( true );
    }
  }
  if (pcVar16 == (char *)0x0) {
    printInstruction(MI,OS,pMVar13);
  }
  else {
    (*cs_mem_free)(pcVar16);
  }
  if (MI->has_imm == true) {
    pcVar9 = MI->flat_insn->detail;
    if ((pcVar9->field_6).x86.op_count < 2) {
      *(uint8_t *)((long)&pcVar9->field_6 + 0x50) = MI->imm_size;
    }
    else if ((MI->flat_insn->id & 0xfffffffe) != 0x9c) {
      pcVar9 = MI->flat_insn->detail;
      bVar3 = (pcVar9->field_6).x86.op_count;
      uVar11 = (ulong)bVar3;
      if (bVar3 != 0) {
        lVar10 = 0x80;
        uVar12 = 0;
        do {
          if (*(int *)(pcVar9->regs_read + lVar10 + -0x20) == 2) {
            pcVar9->regs_read[lVar10] = pcVar9->groups[(ulong)(uint)((int)uVar11 * 0x30) + 0x2e];
          }
          uVar12 = uVar12 + 1;
          pcVar9 = MI->flat_insn->detail;
          uVar11 = (ulong)(pcVar9->field_6).x86.op_count;
          lVar10 = lVar10 + 0x30;
        } while (uVar12 < uVar11);
      }
    }
  }
  if (MI->csh->detail == CS_OPT_OFF) {
    return;
  }
  uVar5 = MCInst_getOpcode(MI);
  if ((int)uVar5 < 0x99a) {
    if ((0x35 < uVar5 - 0x8f1) || ((0x24924900249249U >> ((ulong)(uVar5 - 0x8f1) & 0x3f) & 1) == 0))
    {
      uVar5 = uVar5 - 0x952;
      if (0x2d < uVar5) goto LAB_001454ea;
      uVar11 = 0x249249249249;
LAB_00145449:
      if ((uVar11 >> ((ulong)uVar5 & 0x3f) & 1) == 0) goto LAB_001454ea;
    }
  }
  else if ((0x2e < uVar5 - 0x99a) || ((0x492492249249U >> ((ulong)(uVar5 - 0x99a) & 0x3f) & 1) == 0)
          ) {
    uVar5 = uVar5 - 0xa35;
    if (0x3d < uVar5) goto LAB_001454ea;
    uVar11 = 0x2492490000249249;
    goto LAB_00145449;
  }
  pcVar9 = MI->flat_insn->detail;
  memmove((void *)((long)&pcVar9->field_6 + 0x60),(void *)((long)&pcVar9->field_6 + 0x30),0x150);
  (MI->flat_insn->detail->field_6).x86.operands[0].type = X86_OP_IMM;
  *(undefined8 *)((long)&MI->flat_insn->detail->field_6 + 0x38) = 1;
  *(undefined1 *)((long)&MI->flat_insn->detail->field_6 + 0x50) = 1;
  puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
  *puVar1 = *puVar1 + '\x01';
LAB_001454ea:
  uVar5 = MCInst_getOpcode(MI);
  xVar6 = X86_insn_reg_att(uVar5);
  local_38 = CONCAT44(local_38._4_4_,xVar6);
  if (xVar6 == X86_REG_INVALID) {
    uVar5 = MCInst_getOpcode(MI);
    _Var4 = X86_insn_reg_att2(uVar5,(x86_reg *)&local_38,(x86_reg *)((long)&local_38 + 4));
    if (_Var4) {
      (MI->flat_insn->detail->field_6).x86.operands[0].type = X86_OP_REG;
      (MI->flat_insn->detail->field_6).x86.operands[0].field_1.reg = (x86_reg)local_38;
      *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x50) =
           MI->csh->regsize_map[local_38 & 0xffffffff];
      (MI->flat_insn->detail->field_6).x86.operands[1].type = X86_OP_REG;
      (MI->flat_insn->detail->field_6).x86.operands[1].field_1.reg = local_38._4_4_;
      *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x80) =
           MI->csh->regsize_map[local_38._4_4_];
      (MI->flat_insn->detail->field_6).x86.op_count = '\x02';
    }
  }
  else {
    pcVar9 = MI->flat_insn->detail;
    memmove((void *)((long)&pcVar9->field_6 + 0x60),(void *)((long)&pcVar9->field_6 + 0x30),0x150);
    (MI->flat_insn->detail->field_6).x86.operands[0].type = X86_OP_REG;
    (MI->flat_insn->detail->field_6).x86.operands[0].field_1.reg = xVar6;
    *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x50) = MI->csh->regsize_map[xVar6];
    puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

void X86_ATT_printInst(MCInst *MI, SStream *OS, void *info)
{
	char *mnem;
	x86_reg reg, reg2;
	int i;

	// Output CALLpcrel32 as "callq" in 64-bit mode.
	// In Intel annotation it's always emitted as "call".
	//
	// TODO: Probably this hack should be redesigned via InstAlias in
	// InstrInfo.td as soon as Requires clause is supported properly
	// for InstAlias.
	if (MI->csh->mode == CS_MODE_64 && MCInst_getOpcode(MI) == X86_CALLpcrel32) {
		SStream_concat0(OS, "callq\t");
		MCInst_setOpcodePub(MI, X86_INS_CALL);
		printPCRelImm(MI, 0, OS);
		return;
	}

	// Try to print any aliases first.
	mnem = printAliasInstr(MI, OS, info);
	if (mnem)
		cs_mem_free(mnem);
	else
		printInstruction(MI, OS, info);

	if (MI->has_imm) {
		// if op_count > 1, then this operand's size is taken from the destination op
		if (MI->flat_insn->detail->x86.op_count > 1) {
			if (MI->flat_insn->id != X86_INS_LCALL && MI->flat_insn->id != X86_INS_LJMP) {
				for (i = 0; i < MI->flat_insn->detail->x86.op_count; i++) {
					if (MI->flat_insn->detail->x86.operands[i].type == X86_OP_IMM)
						MI->flat_insn->detail->x86.operands[i].size =
							MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count - 1].size;
				}
			}
		} else
			MI->flat_insn->detail->x86.operands[0].size = MI->imm_size;
	}

	if (MI->csh->detail) {
        // some instructions need to supply immediate 1 in the first op
        switch(MCInst_getOpcode(MI)) {
            default:
                break;
            case X86_SHL8r1:
            case X86_SHL16r1:
            case X86_SHL32r1:
            case X86_SHL64r1:
            case X86_SAL8r1:
            case X86_SAL16r1:
            case X86_SAL32r1:
            case X86_SAL64r1:
            case X86_SHR8r1:
            case X86_SHR16r1:
            case X86_SHR32r1:
            case X86_SHR64r1:
            case X86_SAR8r1:
            case X86_SAR16r1:
            case X86_SAR32r1:
            case X86_SAR64r1:
            case X86_RCL8r1:
            case X86_RCL16r1:
            case X86_RCL32r1:
            case X86_RCL64r1:
            case X86_RCR8r1:
            case X86_RCR16r1:
            case X86_RCR32r1:
            case X86_RCR64r1:
            case X86_ROL8r1:
            case X86_ROL16r1:
            case X86_ROL32r1:
            case X86_ROL64r1:
            case X86_ROR8r1:
            case X86_ROR16r1:
            case X86_ROR32r1:
            case X86_ROR64r1:
            case X86_SHL8m1:
            case X86_SHL16m1:
            case X86_SHL32m1:
            case X86_SHL64m1:
            case X86_SAL8m1:
            case X86_SAL16m1:
            case X86_SAL32m1:
            case X86_SAL64m1:
            case X86_SHR8m1:
            case X86_SHR16m1:
            case X86_SHR32m1:
            case X86_SHR64m1:
            case X86_SAR8m1:
            case X86_SAR16m1:
            case X86_SAR32m1:
            case X86_SAR64m1:
            case X86_RCL8m1:
            case X86_RCL16m1:
            case X86_RCL32m1:
            case X86_RCL64m1:
            case X86_RCR8m1:
            case X86_RCR16m1:
            case X86_RCR32m1:
            case X86_RCR64m1:
            case X86_ROL8m1:
            case X86_ROL16m1:
            case X86_ROL32m1:
            case X86_ROL64m1:
            case X86_ROR8m1:
            case X86_ROR16m1:
            case X86_ROR32m1:
            case X86_ROR64m1:
                // shift all the ops right to leave 1st slot for this new register op
                memmove(&(MI->flat_insn->detail->x86.operands[1]), &(MI->flat_insn->detail->x86.operands[0]),
                        sizeof(MI->flat_insn->detail->x86.operands[0]) * (ARR_SIZE(MI->flat_insn->detail->x86.operands) - 1));
                MI->flat_insn->detail->x86.operands[0].type = X86_OP_IMM;
                MI->flat_insn->detail->x86.operands[0].imm = 1;
                MI->flat_insn->detail->x86.operands[0].size = 1;
                MI->flat_insn->detail->x86.op_count++;
        }

		// special instruction needs to supply register op
		// first op can be embedded in the asm by llvm.
		// so we have to add the missing register as the first operand
		reg = X86_insn_reg_att(MCInst_getOpcode(MI));
		if (reg) {
			// shift all the ops right to leave 1st slot for this new register op
			memmove(&(MI->flat_insn->detail->x86.operands[1]), &(MI->flat_insn->detail->x86.operands[0]),
					sizeof(MI->flat_insn->detail->x86.operands[0]) * (ARR_SIZE(MI->flat_insn->detail->x86.operands) - 1));
			MI->flat_insn->detail->x86.operands[0].type = X86_OP_REG;
			MI->flat_insn->detail->x86.operands[0].reg = reg;
			MI->flat_insn->detail->x86.operands[0].size = MI->csh->regsize_map[reg];
			MI->flat_insn->detail->x86.op_count++;
		} else {
			if (X86_insn_reg_att2(MCInst_getOpcode(MI), &reg, &reg2)) {
				MI->flat_insn->detail->x86.operands[0].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[0].reg = reg;
				MI->flat_insn->detail->x86.operands[0].size = MI->csh->regsize_map[reg];
				MI->flat_insn->detail->x86.operands[1].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[1].reg = reg2;
				MI->flat_insn->detail->x86.operands[1].size = MI->csh->regsize_map[reg2];
				MI->flat_insn->detail->x86.op_count = 2;
			}
		}
	}
}